

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTest.cpp
# Opt level: O3

bool __thiscall BaseTest::testEqual(BaseTest *this)

{
  pointer pRVar1;
  long lVar2;
  ulong uVar3;
  rep *prVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar5 = (ulong)this->N;
  bVar7 = true;
  if (1 < (long)uVar5) {
    pRVar1 = (this->results).super__Vector_base<BaseTest::Result,_std::allocator<BaseTest::Result>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0.001 <= ABS((double)pRVar1[1].time - (double)pRVar1->time)) {
      return false;
    }
    prVar4 = &pRVar1[2].time;
    uVar3 = 2;
    do {
      uVar6 = uVar3;
      if (uVar5 == uVar6) break;
      lVar2 = *prVar4;
      prVar4 = prVar4 + 4;
      uVar3 = uVar6 + 1;
    } while (ABS((double)lVar2 - (double)pRVar1->time) < 0.001);
    bVar7 = uVar5 <= uVar6;
  }
  return bVar7;
}

Assistant:

bool BaseTest::testEqual()
{
	auto deq = [](double a, double b)
	{ return std::abs(a - b) < 1e-3; };
	for (int i = 1; i < N; ++i)
		if (!deq(results[i].time, results[0].time))
			return false;
	return true;
}